

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O2

void __thiscall google::protobuf::strings::ArrayByteSource::Skip(ArrayByteSource *this,size_t n)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((ulong)(this->input_).length_ < n) {
    protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/bytestream.cc"
               ,0x9d);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (n) <= (input_.size()): ");
    protobuf::internal::LogFinisher::operator=(&local_21,other);
    protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  StringPiece::remove_prefix(&this->input_,n);
  return;
}

Assistant:

void ArrayByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, input_.size());
  input_.remove_prefix(n);
}